

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CalQLParser.cpp
# Opt level: O0

void __thiscall cali::CalQLParser::CalQLParserImpl::parse_where(CalQLParserImpl *this,istream *is)

{
  uint uVar1;
  bool bVar2;
  undefined1 local_68 [8];
  Condition cond;
  char c;
  istream *is_local;
  CalQLParserImpl *this_local;
  
  cond.value.field_2._M_local_buf[0xf] = '\0';
  do {
    parse_filter_clause((Condition *)local_68,this,is);
    if (((this->error & 1U) == 0) && (local_68._0_4_ != None)) {
      (this->spec).filter.selection = List;
      std::vector<cali::QuerySpec::Condition,_std::allocator<cali::QuerySpec::Condition>_>::
      push_back(&(this->spec).filter.list,(value_type *)local_68);
    }
    cond.value.field_2._M_local_buf[0xf] = util::read_char(is);
    QuerySpec::Condition::~Condition((Condition *)local_68);
    bVar2 = false;
    if ((this->error & 1U) == 0) {
      uVar1 = std::ios::good();
      bVar2 = false;
      if ((uVar1 & 1) != 0) {
        bVar2 = cond.value.field_2._M_local_buf[0xf] == ',';
      }
    }
  } while (bVar2);
  if (cond.value.field_2._M_local_buf[0xf] != '\0') {
    std::istream::unget();
  }
  return;
}

Assistant:

void parse_where(std::istream& is)
    {
        char c = '\0';

        do {
            QuerySpec::Condition cond = parse_filter_clause(is);

            if (!error && cond.op != QuerySpec::Condition::None) {
                spec.filter.selection = QuerySpec::FilterSelection::List;
                spec.filter.list.push_back(cond);
            }

            c = util::read_char(is);
        } while (!error && is.good() && c == ',');

        if (c)
            is.unget();
    }